

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O0

uint sf::Texture::getValidSize(uint size)

{
  undefined4 local_14;
  uint powerOfTwo;
  uint size_local;
  
  powerOfTwo = size;
  if (sfogl_ext_ARB_texture_non_power_of_two == 0) {
    for (local_14 = 1; local_14 < size; local_14 = local_14 << 1) {
    }
    powerOfTwo = local_14;
  }
  return powerOfTwo;
}

Assistant:

unsigned int Texture::getValidSize(unsigned int size)
{
    if (GLEXT_texture_non_power_of_two)
    {
        // If hardware supports NPOT textures, then just return the unmodified size
        return size;
    }
    else
    {
        // If hardware doesn't support NPOT textures, we calculate the nearest power of two
        unsigned int powerOfTwo = 1;
        while (powerOfTwo < size)
            powerOfTwo *= 2;

        return powerOfTwo;
    }
}